

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O1

bool __thiscall Clasp::DefaultMinimize::relaxBound(DefaultMinimize *this,bool full)

{
  long *plVar1;
  SharedData *pSVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  auVar4 = _DAT_001ad1c0;
  auVar3 = _DAT_001ad1b0;
  plVar1 = this->bounds_;
  if ((*plVar1 != 0x7fffffffffffffff) && ((ulong)this->size_ != 0)) {
    uVar5 = (ulong)this->size_ + 0x1fffffffffffffff;
    uVar6 = uVar5 & 0x1fffffffffffffff;
    auVar9._8_4_ = (int)uVar6;
    auVar9._0_8_ = uVar6;
    auVar9._12_4_ = (int)(uVar6 >> 0x20);
    lVar7 = 0;
    auVar9 = auVar9 ^ _DAT_001ad1c0;
    do {
      auVar10._8_4_ = (int)lVar7;
      auVar10._0_8_ = lVar7;
      auVar10._12_4_ = (int)((ulong)lVar7 >> 0x20);
      auVar10 = (auVar10 | auVar3) ^ auVar4;
      if ((bool)(~(auVar10._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar10._0_4_ ||
                  auVar9._4_4_ < auVar10._4_4_) & 1)) {
        plVar1[lVar7] = 0x7fffffffffffffff;
      }
      if ((auVar10._12_4_ != auVar9._12_4_ || auVar10._8_4_ <= auVar9._8_4_) &&
          auVar10._12_4_ <= auVar9._12_4_) {
        plVar1[lVar7 + 1] = 0x7fffffffffffffff;
      }
      lVar7 = lVar7 + 2;
    } while ((uVar6 - ((uint)uVar5 & 1)) + 2 != lVar7);
  }
  pSVar2 = (this->super_MinimizeConstraint).shared_;
  this->pos_ = (Iter)(pSVar2 + 1);
  this->actLev_ = 0;
  if (!full) {
    if (pSVar2->optGen_ == 0) {
      bVar8 = pSVar2->mode_ == enumerate;
    }
    else {
      if (pSVar2->mode_ == enumerate) goto LAB_00151c50;
      bVar8 = (pSVar2->gCount_).super___atomic_base<unsigned_int>._M_i == pSVar2->optGen_;
    }
    if (!bVar8) {
      return true;
    }
  }
LAB_00151c50:
  stepInit(this,0);
  return true;
}

Assistant:

bool DefaultMinimize::relaxBound(bool full) {
	if (active()) { std::fill(opt(), opt()+size_, SharedData::maxBound()); }
	pos_       = shared_->lits;
	actLev_    = 0;
	if (full || !shared_->optimize()) { stepInit(0); }
	return true;
}